

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBCopyYToAlphaRow_SSE2(uint8_t *src,uint8_t *dst,int width)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [14];
  undefined1 auVar8 [12];
  unkbyte10 Var9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar25 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 uVar23;
  undefined2 uVar24;
  
  do {
    uVar1 = *(ulong *)src;
    src = (uint8_t *)((long)src + 8);
    uVar23 = (undefined1)(uVar1 >> 0x38);
    auVar18._8_6_ = 0;
    auVar18._0_8_ = uVar1;
    auVar18[0xe] = uVar23;
    auVar18[0xf] = uVar23;
    uVar23 = (undefined1)(uVar1 >> 0x30);
    auVar17._14_2_ = auVar18._14_2_;
    auVar17._8_5_ = 0;
    auVar17._0_8_ = uVar1;
    auVar17[0xd] = uVar23;
    auVar16._13_3_ = auVar17._13_3_;
    auVar16._8_4_ = 0;
    auVar16._0_8_ = uVar1;
    auVar16[0xc] = uVar23;
    uVar23 = (undefined1)(uVar1 >> 0x28);
    auVar15._12_4_ = auVar16._12_4_;
    auVar15._8_3_ = 0;
    auVar15._0_8_ = uVar1;
    auVar15[0xb] = uVar23;
    auVar14._11_5_ = auVar15._11_5_;
    auVar14._8_2_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14[10] = uVar23;
    uVar23 = (undefined1)(uVar1 >> 0x20);
    auVar13._10_6_ = auVar14._10_6_;
    auVar13[8] = 0;
    auVar13._0_8_ = uVar1;
    auVar13[9] = uVar23;
    auVar12._9_7_ = auVar13._9_7_;
    auVar12[8] = uVar23;
    auVar12._0_8_ = uVar1;
    uVar23 = (undefined1)(uVar1 >> 0x18);
    Var9 = CONCAT91(CONCAT81(auVar12._8_8_,uVar23),uVar23);
    uVar23 = (undefined1)(uVar1 >> 0x10);
    auVar8._2_10_ = Var9;
    auVar8[1] = uVar23;
    auVar8[0] = uVar23;
    uVar23 = (undefined1)(uVar1 >> 8);
    auVar7._2_12_ = auVar8;
    auVar7[1] = uVar23;
    auVar7[0] = uVar23;
    auVar11._0_2_ = CONCAT11((char)uVar1,(char)uVar1);
    auVar11._2_14_ = auVar7;
    auVar25._2_2_ = auVar12._8_2_;
    auVar25._0_2_ = in_XMM3._8_2_;
    auVar25._4_2_ = in_XMM3._10_2_;
    auVar25._6_2_ = auVar14._10_2_;
    auVar25._8_2_ = in_XMM3._12_2_;
    auVar25._10_2_ = auVar16._12_2_;
    auVar25._12_2_ = in_XMM3._14_2_;
    auVar25._14_2_ = auVar17._14_2_;
    uVar24 = (undefined2)Var9;
    auVar22._0_12_ = auVar11._0_12_;
    auVar22._12_2_ = uVar24;
    auVar22._14_2_ = uVar24;
    auVar21._12_4_ = auVar22._12_4_;
    auVar21._0_10_ = auVar11._0_10_;
    auVar21._10_2_ = auVar8._0_2_;
    auVar20._10_6_ = auVar21._10_6_;
    auVar20._0_8_ = auVar11._0_8_;
    auVar20._8_2_ = auVar8._0_2_;
    auVar19._8_8_ = auVar20._8_8_;
    auVar19._6_2_ = auVar7._0_2_;
    auVar19._4_2_ = auVar7._0_2_;
    auVar19._2_2_ = auVar11._0_2_;
    auVar19._0_2_ = auVar11._0_2_;
    auVar3[0xb] = 0xff;
    auVar3._0_11_ = ZEXT811(0xff000000ff000000);
    auVar3._12_3_ = 0;
    auVar3[0xf] = 0xff;
    auVar4[0xb] = 0xff;
    auVar4._0_11_ = ZEXT811(0xff000000ff000000);
    auVar4._12_3_ = 0;
    auVar4[0xf] = 0xff;
    auVar5[8] = 0xff;
    auVar5._0_8_ = 0xffffff00ffffff;
    auVar5[9] = 0xff;
    auVar5[10] = 0xff;
    auVar5[0xb] = 0;
    auVar5[0xc] = 0xff;
    auVar5[0xd] = 0xff;
    auVar5[0xe] = 0xff;
    auVar5[0xf] = 0;
    auVar6[8] = 0xff;
    auVar6._0_8_ = 0xffffff00ffffff;
    auVar6[9] = 0xff;
    auVar6[10] = 0xff;
    auVar6[0xb] = 0;
    auVar6[0xc] = 0xff;
    auVar6[0xd] = 0xff;
    auVar6[0xe] = 0xff;
    auVar6[0xf] = 0;
    in_XMM3 = auVar25 & auVar4 | *(undefined1 (*) [16])((long)dst + 0x10) & auVar6;
    *(undefined1 (*) [16])dst = auVar19 & auVar3 | *(undefined1 (*) [16])dst & auVar5;
    *(undefined1 (*) [16])((long)dst + 0x10) = in_XMM3;
    dst = (uint8_t *)((long)dst + 0x20);
    iVar10 = width + -8;
    bVar2 = 7 < width;
    width = iVar10;
  } while (iVar10 != 0 && bVar2);
  return;
}

Assistant:

void ARGBCopyYToAlphaRow_SSE2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "pcmpeqb     %%xmm0,%%xmm0                 \n"
      "pslld       $0x18,%%xmm0                  \n"
      "pcmpeqb     %%xmm1,%%xmm1                 \n"
      "psrld       $0x8,%%xmm1                   \n"

      LABELALIGN
      "1:                                        \n"
      "movq        (%0),%%xmm2                   \n"
      "lea         0x8(%0),%0                    \n"
      "punpcklbw   %%xmm2,%%xmm2                 \n"
      "punpckhwd   %%xmm2,%%xmm3                 \n"
      "punpcklwd   %%xmm2,%%xmm2                 \n"
      "movdqu      (%1),%%xmm4                   \n"
      "movdqu      0x10(%1),%%xmm5               \n"
      "pand        %%xmm0,%%xmm2                 \n"
      "pand        %%xmm0,%%xmm3                 \n"
      "pand        %%xmm1,%%xmm4                 \n"
      "pand        %%xmm1,%%xmm5                 \n"
      "por         %%xmm4,%%xmm2                 \n"
      "por         %%xmm5,%%xmm3                 \n"
      "movdqu      %%xmm2,(%1)                   \n"
      "movdqu      %%xmm3,0x10(%1)               \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}